

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRTreeBuildVisitor.cpp
# Opt level: O2

void __thiscall
IRTreeBuildVisitor::Visit(IRTreeBuildVisitor *this,MethodInvocation *method_invocation)

{
  string *name;
  MethodExpression *pMVar1;
  pointer ppEVar2;
  bool bVar3;
  int iVar4;
  ExpressionList *this_00;
  Expression *expression;
  ExpressionWrapper *pEVar5;
  undefined4 extraout_var;
  SubtreeWrapper *pSVar6;
  undefined4 extraout_var_00;
  CallExpression *this_01;
  NameExpression *this_02;
  pointer ppEVar7;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  Symbol class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Label local_90;
  string local_70;
  string local_50;
  
  this_00 = (ExpressionList *)operator_new(0x20);
  (this_00->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__ExpressionList_00161f48;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->expressions_).super__Vector_base<IRT::Expression_*,_std::allocator<IRT::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  name = &method_invocation->call_from_;
  expression = IRT::FrameTranslator::GetAddress(this->current_frame_,name);
  pEVar5 = (ExpressionWrapper *)operator_new(0x10);
  IRT::ExpressionWrapper::ExpressionWrapper(pEVar5,expression);
  iVar4 = (*(pEVar5->super_SubtreeWrapper)._vptr_SubtreeWrapper[2])(pEVar5);
  IRT::ExpressionList::Add(this_00,(Expression *)CONCAT44(extraout_var,iVar4));
  pMVar1 = method_invocation->arguments_list_;
  if (pMVar1 != (MethodExpression *)0x0) {
    ppEVar2 = (pMVar1->list_of_expressions_).
              super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppEVar7 = (pMVar1->list_of_expressions_).
                   super__Vector_base<Expression_*,_std::allocator<Expression_*>_>._M_impl.
                   super__Vector_impl_data._M_start; ppEVar7 != ppEVar2; ppEVar7 = ppEVar7 + 1) {
      pSVar6 = TemplateVisitor<IRT::SubtreeWrapper_*>::Accept
                         (&this->super_TemplateVisitor<IRT::SubtreeWrapper_*>,
                          &(*ppEVar7)->super_Node);
      iVar4 = (*pSVar6->_vptr_SubtreeWrapper[2])(pSVar6);
      IRT::ExpressionList::Add(this_00,(Expression *)CONCAT44(extraout_var_00,iVar4));
    }
  }
  class_name.name_._M_dataplus._M_p = (pointer)&class_name.name_.field_2;
  class_name.name_._M_string_length = 0;
  class_name.name_.field_2._M_local_buf[0] = '\0';
  bVar3 = std::operator==(name,"this");
  if (bVar3) {
    std::__cxx11::string::_M_assign((string *)&class_name);
  }
  else {
    std::__cxx11::string::string((string *)&local_50,(string *)name);
    Symbol::Symbol((Symbol *)&local_f0,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    TypeResolving_abi_cxx11_(&local_70,this,(Symbol *)&local_f0);
    Symbol::Symbol((Symbol *)&local_110,&local_70);
    std::__cxx11::string::_M_assign((string *)&class_name);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  pEVar5 = (ExpressionWrapper *)operator_new(0x10);
  this_01 = (CallExpression *)operator_new(0x18);
  this_02 = (NameExpression *)operator_new(0x28);
  Symbol::GetName_abi_cxx11_(&local_110,&class_name);
  std::operator+(&local_f0,&local_110,"_");
  std::operator+(&local_b0,&local_f0,&method_invocation->method_name_);
  IRT::Label::Label(&local_90,&local_b0);
  IRT::NameExpression::NameExpression(this_02,&local_90);
  IRT::CallExpression::CallExpression(this_01,(Expression *)this_02,this_00);
  IRT::ExpressionWrapper::ExpressionWrapper(pEVar5,(Expression *)this_01);
  (this->super_TemplateVisitor<IRT::SubtreeWrapper_*>).tos_value_ = (SubtreeWrapper *)pEVar5;
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&class_name);
  return;
}

Assistant:

void IRTreeBuildVisitor::Visit(MethodInvocation* method_invocation) {
  auto* irt_expressions = new IRT::ExpressionList();

  auto address = current_frame_->GetAddress(method_invocation->call_from_);
  irt_expressions->Add((new IRT::ExpressionWrapper(address))->ToExpression());

  if (method_invocation->arguments_list_ != nullptr) {
    for (auto expr : method_invocation->arguments_list_->list_of_expressions_) {
      irt_expressions->Add(Accept(expr)->ToExpression());
    }
  }

  Symbol class_name;
  if (method_invocation->call_from_ == "this") {
    class_name = current_layer_->class_symbol_;
  } else {
    const Symbol& symbol = Symbol(method_invocation->call_from_);

    class_name = Symbol(TypeResolving(symbol));
  }

  tos_value_ = new IRT::ExpressionWrapper(new IRT::CallExpression(
      new IRT::NameExpression(IRT::Label(
          class_name.GetName() + "_" + method_invocation->method_name_)),
      irt_expressions));
}